

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitterByCenter.hpp
# Opt level: O2

void __thiscall
NBvh3::SplitterByCenter<NBvh3::KDop<16U>_>::split
          (SplitterByCenter<NBvh3::KDop<16U>_> *this,TVertices *left,TVertices *right)

{
  pointer pSVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  TVertices *this_00;
  
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    pSVar1 = (this->mVertices->super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->mVertices->
                       super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pSVar1) / 0xc) <= uVar4) break;
    bVar2 = isRight(this,pSVar1 + uVar4);
    this_00 = left;
    if (bVar2) {
      this_00 = right;
    }
    std::vector<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>::push_back
              (this_00,(this->mVertices->
                       super__Vector_base<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar4);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void SplitterByCenter<TBv>::split(TVertices& left, TVertices& right) const
{
    for (unsigned i = 0; i < mVertices.size(); ++i)
    {
        if (isRight(mVertices[i]))
        {
            right.push_back(mVertices[i]);
        }
        else
        {
            left.push_back(mVertices[i]);
        }
    }
}